

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogLocalResolve(void *catalogs,xmlChar *pubID,xmlChar *sysID)

{
  xmlChar *pxVar1;
  char *fmt;
  
  if (pubID == (xmlChar *)0x0 && sysID == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  if (xmlDebugCatalogs != 0) {
    if (sysID == (xmlChar *)0x0 || pubID == (xmlChar *)0x0) {
      if (pubID == (xmlChar *)0x0) {
        fmt = "Local Resolve: sysID %s\n";
        pxVar1 = sysID;
      }
      else {
        fmt = "Local Resolve: pubID %s\n";
        pxVar1 = pubID;
      }
      xmlCatalogPrintDebug(fmt,pxVar1);
    }
    else {
      xmlCatalogPrintDebug("Local Resolve: pubID %s sysID %s\n",pubID,sysID);
    }
  }
  if ((catalogs != (void *)0x0) &&
     (pxVar1 = xmlCatalogListXMLResolve((xmlCatalogEntryPtr)catalogs,pubID,sysID),
     &DAT_00000001 < pxVar1 + 1)) {
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlCatalogLocalResolve(void *catalogs, const xmlChar *pubID,
	               const xmlChar *sysID) {
    xmlCatalogEntryPtr catal;
    xmlChar *ret;

    if ((pubID == NULL) && (sysID == NULL))
	return(NULL);

    if (xmlDebugCatalogs) {
        if ((pubID != NULL) && (sysID != NULL)) {
            xmlCatalogPrintDebug(
                            "Local Resolve: pubID %s sysID %s\n", pubID, sysID);
        } else if (pubID != NULL) {
            xmlCatalogPrintDebug(
                            "Local Resolve: pubID %s\n", pubID);
        } else {
            xmlCatalogPrintDebug(
                            "Local Resolve: sysID %s\n", sysID);
        }
    }

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal == NULL)
	return(NULL);
    ret = xmlCatalogListXMLResolve(catal, pubID, sysID);
    if ((ret != NULL) && (ret != XML_CATAL_BREAK))
	return(ret);
    return(NULL);
}